

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ITrackerPtr __thiscall
Catch::TestCaseTracking::TrackerBase::findChild(TrackerBase *this,NameAndLocation *nameAndLocation)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  long lVar2;
  long lVar3;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  _Var4;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __it;
  ITrackerPtr IVar5;
  _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
  local_40 [8];
  __shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2> *local_38;
  
  __it._M_current =
       *(shared_ptr<Catch::TestCaseTracking::ITracker> **)
        ((long)&nameAndLocation[1].name.field_2 + 8);
  local_38 = (__shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2> *)
             nameAndLocation[1].location.file;
  lVar2 = (long)local_38 - (long)__it._M_current;
  for (lVar3 = lVar2 >> 6; _Var4._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
            ::operator()(local_40,__it);
    in_RDX._M_pi = extraout_RDX;
    if (bVar1) goto LAB_0011e8aa;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
            ::operator()(local_40,__it._M_current + 1);
    in_RDX._M_pi = extraout_RDX_00;
    _Var4._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_0011e8aa;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
            ::operator()(local_40,__it._M_current + 2);
    in_RDX._M_pi = extraout_RDX_01;
    _Var4._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_0011e8aa;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
            ::operator()(local_40,__it._M_current + 3);
    in_RDX._M_pi = extraout_RDX_02;
    _Var4._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_0011e8aa;
    __it._M_current = __it._M_current + 4;
    lVar2 = lVar2 + -0x40;
  }
  lVar2 = lVar2 >> 4;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      _Var4._M_current = (shared_ptr<Catch::TestCaseTracking::ITracker> *)local_38;
      if ((lVar2 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
                  ::operator()(local_40,__it), in_RDX._M_pi = extraout_RDX_03,
         _Var4._M_current = __it._M_current, bVar1)) goto LAB_0011e8aa;
      _Var4._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
            ::operator()(local_40,_Var4);
    in_RDX._M_pi = extraout_RDX_04;
    if (bVar1) goto LAB_0011e8aa;
    __it._M_current = _Var4._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
          ::operator()(local_40,__it);
  in_RDX._M_pi = extraout_RDX_06;
  _Var4._M_current = (shared_ptr<Catch::TestCaseTracking::ITracker> *)local_38;
  if (bVar1) {
    _Var4._M_current = __it._M_current;
  }
LAB_0011e8aa:
  if (&(_Var4._M_current)->
       super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2> ==
      (__shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2> *)
      nameAndLocation[1].location.file) {
    (this->super_ITracker)._vptr_ITracker = (_func_int **)0x0;
    (this->super_ITracker).m_nameAndLocation.name._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    clara::std::__shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2> *)this
                 ,&(_Var4._M_current)->
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                );
    in_RDX._M_pi = extraout_RDX_05;
  }
  IVar5.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  IVar5.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ITracker;
  return (ITrackerPtr)
         IVar5.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ITrackerPtr TrackerBase::findChild( NameAndLocation const& nameAndLocation ) {
        auto it = std::find_if( m_children.begin(), m_children.end(),
            [&nameAndLocation]( ITrackerPtr const& tracker ){
                return
                    tracker->nameAndLocation().location == nameAndLocation.location &&
                    tracker->nameAndLocation().name == nameAndLocation.name;
            } );
        return( it != m_children.end() )
            ? *it
            : nullptr;
    }